

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SMBusAnalyzerResults::GetBubbleText
          (SMBusAnalyzerResults *this,Frame *f,DisplayBase display_base,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  long lVar1;
  undefined8 uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  char *pcVar4;
  CommandDesc *pCVar5;
  ulong uVar6;
  reference pvVar7;
  reference pvVar8;
  char *local_2098;
  allocator local_1f69;
  string local_1f68 [32];
  string local_1f48 [32];
  undefined8 *local_1f28;
  SMBusProtocol *pProt;
  string local_1f18 [32];
  string local_1ef8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ed8 [32];
  string local_1eb8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e78 [32];
  string local_1e58 [32];
  string local_1e38 [32];
  string local_1e18 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1df8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1dd8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1db8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d98 [8];
  string date;
  value_type local_1d70 [4];
  U16 year;
  U8 month;
  U8 day;
  string val_6;
  string local_1d50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d30 [32];
  string local_1d10 [32];
  string local_1cf0 [32];
  string local_1cd0 [32];
  string local_1cb0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bf0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bd0 [32];
  string local_1bb0 [32];
  string local_1b90 [32];
  string local_1b70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1af0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ad0 [32];
  string local_1ab0 [32];
  string local_1a90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a30 [32];
  string local_1a10 [32];
  string local_19f0 [32];
  string local_19d0 [32];
  string local_19b0 [32];
  string local_1990 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1970 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1950 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1930 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1910 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1890 [36];
  byte local_186c;
  byte local_186b;
  byte local_186a;
  byte local_1869;
  value_type local_1868 [4];
  U8 ipscale;
  U8 vscale;
  U8 version;
  U8 revision;
  string val_5;
  allocator local_1841;
  string local_1840 [32];
  string local_1820 [32];
  undefined1 local_1800 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17c8 [8];
  string prefix_1;
  value_type local_17a8 [8];
  string val_4;
  allocator local_1781;
  string local_1780 [32];
  undefined1 local_1760 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1728 [8];
  string prefix;
  value_type local_1708 [8];
  string val_3;
  string local_16e8 [32];
  string local_16c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1688 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1668 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1648 [38];
  byte local_1622;
  byte local_1621;
  value_type local_1620 [6];
  U8 param;
  U8 mode;
  string val_2;
  string local_1600 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1580 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1560 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1540 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1520 [32];
  string local_1500 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1480 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1460 [32];
  string local_1440 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1420 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1400 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13e0 [32];
  string local_13c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1380 [32];
  string local_1360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1320 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1300 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1260 [32];
  char *local_1240;
  char *action;
  char *polarity;
  char *control;
  char *commands;
  char *power_up;
  string val_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d8 [39];
  allocator local_11b1;
  string local_11b0 [32];
  string local_1190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110 [32];
  value_type local_10f0 [8];
  string val;
  char *margin_state;
  string local_10c0 [8];
  string unit_on_off;
  allocator local_1099;
  string local_1098 [39];
  allocator local_1071;
  string local_1070 [39];
  allocator local_1049;
  string local_1048 [39];
  allocator local_1021;
  string local_1020 [39];
  allocator local_ff9;
  string local_ff8 [39];
  allocator local_fd1;
  string local_fd0 [39];
  allocator local_fa9;
  string local_fa8 [39];
  allocator local_f81;
  string local_f80 [39];
  allocator local_f59;
  string local_f58 [39];
  allocator local_f31;
  string local_f30 [39];
  allocator local_f09;
  string local_f08 [39];
  allocator local_ee1;
  string local_ee0 [39];
  allocator local_eb9;
  string local_eb8 [39];
  allocator local_e91;
  string local_e90 [39];
  allocator local_e69;
  string local_e68 [39];
  allocator local_e41;
  string local_e40 [39];
  allocator local_e19;
  string local_e18 [39];
  allocator local_df1;
  string local_df0 [32];
  string local_dd0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0 [32];
  string local_d90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50 [32];
  string local_d30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0 [32];
  char *local_cd0;
  char *format;
  char *for_read;
  string local_cb8 [8];
  string for_write;
  string local_c90 [7];
  U8 bm_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10 [32];
  string local_bf0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90 [32];
  string local_b70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50 [32];
  string local_b30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0 [32];
  value_type local_a90 [8];
  string val_str;
  char *smbalert_desc;
  char *max_bus_speed;
  char *pec_desc;
  value_type local_a50 [7];
  U8 bm;
  value_type local_a30 [32];
  value_type local_a10 [8];
  string id_1;
  value_type local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [32];
  value_type local_9a8 [39];
  allocator local_981;
  string local_980 [32];
  string local_960 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920 [32];
  value_type local_900 [39];
  allocator local_8d9;
  string local_8d8 [32];
  value_type local_8b8 [39];
  allocator local_891;
  string local_890 [39];
  allocator local_869;
  string local_868 [32];
  string local_848 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808 [32];
  value_type local_7e8 [8];
  string id;
  CommandDesc cmd;
  value_type local_788 [32];
  value_type local_768 [32];
  value_type local_748 [8];
  string bc_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8 [38];
  byte local_482;
  allocator local_481;
  string local_480 [6];
  bool is_acked;
  string rw_s;
  allocator local_459;
  string local_458 [8];
  string rw;
  value_type local_438 [8];
  string addr;
  allocator local_411;
  string local_410 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0 [32];
  string local_3d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390 [39];
  allocator local_369;
  string local_368 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348 [32];
  string local_328 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308 [32];
  string local_2e8 [8];
  string calcedPEC;
  value_type local_2c8 [8];
  string readPEC;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [32];
  string local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [32];
  string local_248 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [32];
  value_type local_208 [8];
  string num_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [32];
  string local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [32];
  string local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [32];
  value_type local_148 [8];
  string num;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *results_local;
  Frame *pFStack_18;
  DisplayBase display_base_local;
  Frame *f_local;
  SMBusAnalyzerResults *this_local;
  
  local_28 = results;
  results_local._4_4_ = display_base;
  pFStack_18 = f;
  f_local = (Frame *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  pvVar3 = local_28;
  if (pFStack_18[0x20] == (Frame)0x0) {
    if (this->mSettings->mDecodeLevel == DL_Signals) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"Start",&local_49);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_48);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
  }
  else if (pFStack_18[0x20] == (Frame)0x1) {
    if (this->mSettings->mDecodeLevel == DL_Signals) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"Stop",&local_81);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_80);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
  }
  else if (pFStack_18[0x20] == (Frame)0x2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"0",&local_a9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,(value_type *)local_a8);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  else if (pFStack_18[0x20] == (Frame)0x3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"1",&local_d1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,(value_type *)local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  else if (pFStack_18[0x20] == (Frame)0x4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"ACK",&local_f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,(value_type *)local_f8);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  else if (pFStack_18[0x20] == (Frame)0x5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"NACK",&local_121);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,(value_type *)local_120);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  else if (pFStack_18[0x20] == (Frame)0x6) {
    int2str_sal_abi_cxx11_
              ((U64)local_148,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    pvVar3 = local_28;
    std::operator+((char *)local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Byte ");
    std::operator+(local_168,(char *)local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_168);
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string(local_188);
    pvVar3 = local_28;
    std::operator+((char *)local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Byte ");
    std::operator+(local_1a8,(char *)local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::~string(local_1c8);
    pvVar3 = local_28;
    std::operator+(local_1e8,(char *)local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_148);
    std::__cxx11::string::~string((string *)local_148);
  }
  else if (pFStack_18[0x20] == (Frame)0x7) {
    int2str_sal_abi_cxx11_
              ((U64)local_208,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    pvVar3 = local_28;
    std::operator+((char *)local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Word ");
    std::operator+(local_228,(char *)local_248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_228);
    std::__cxx11::string::~string((string *)local_228);
    std::__cxx11::string::~string(local_248);
    pvVar3 = local_28;
    std::operator+((char *)local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Word ");
    std::operator+(local_268,(char *)local_288);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_268);
    std::__cxx11::string::~string((string *)local_268);
    std::__cxx11::string::~string(local_288);
    pvVar3 = local_28;
    std::operator+(local_2a8,(char *)local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_2a8);
    std::__cxx11::string::~string((string *)local_2a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_208);
    std::__cxx11::string::~string((string *)local_208);
  }
  else if (pFStack_18[0x20] == (Frame)0x9) {
    int2str_sal_abi_cxx11_
              ((U64)local_2c8,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    int2str_sal_abi_cxx11_
              ((U64)local_2e8,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x18),results_local._4_4_);
    pvVar3 = local_28;
    if (*(long *)(pFStack_18 + 0x10) == *(long *)(pFStack_18 + 0x18)) {
      std::operator+((char *)local_328,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1282cf);
      std::operator+(local_308,(char *)local_328);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,local_308);
      std::__cxx11::string::~string((string *)local_308);
      std::__cxx11::string::~string(local_328);
      pvVar3 = local_28;
      std::operator+(local_348,(char *)local_2c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,local_348);
      std::__cxx11::string::~string((string *)local_348);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,"PEC OK",&local_369);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_368);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
    }
    else {
      std::operator+((char *)local_3d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Bad PEC "
                    );
      std::operator+(local_3b0,(char *)local_3d0);
      std::operator+(local_390,local_3b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,local_390);
      std::__cxx11::string::~string((string *)local_390);
      std::__cxx11::string::~string((string *)local_3b0);
      std::__cxx11::string::~string(local_3d0);
      pvVar3 = local_28;
      std::operator+(local_3f0,(char *)local_2c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,local_3f0);
      std::__cxx11::string::~string((string *)local_3f0);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_410,"Bad PEC!",&local_411);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_410);
      std::__cxx11::string::~string(local_410);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_2c8);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string((string *)local_2c8);
  }
  else if (pFStack_18[0x20] == (Frame)0x8) {
    int2str_sal_abi_cxx11_
              ((U64)local_438,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    pcVar4 = "Write ";
    if (((byte)pFStack_18[0x21] & 2) != 0) {
      pcVar4 = "Read ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_458,pcVar4,&local_459);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    if (((byte)pFStack_18[0x21] & 2) == 0) {
      local_2098 = "W ";
    }
    else {
      local_2098 = "R ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,local_2098,&local_481);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    pvVar3 = local_28;
    local_482 = (byte)pFStack_18[0x21] & 1;
    std::operator+(local_4e8,(char *)local_458);
    std::operator+(local_4c8,local_4e8);
    std::operator+(local_4a8,(char *)local_4c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_4a8);
    std::__cxx11::string::~string((string *)local_4a8);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::string::~string((string *)local_4e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_438);
    pvVar3 = local_28;
    std::operator+(local_508,(char *)local_438);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_508);
    std::__cxx11::string::~string((string *)local_508);
    pvVar3 = local_28;
    std::operator+(local_548,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
    std::operator+(local_528,(char *)local_548);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_528);
    std::__cxx11::string::~string((string *)local_528);
    std::__cxx11::string::~string((string *)local_548);
    pvVar3 = local_28;
    std::operator+(local_588,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
    std::operator+(local_568,(char *)local_588);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_568);
    std::__cxx11::string::~string((string *)local_568);
    std::__cxx11::string::~string((string *)local_588);
    pvVar3 = local_28;
    std::operator+(local_5c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480);
    std::operator+(local_5a8,(char *)local_5c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_5a8);
    std::__cxx11::string::~string((string *)local_5a8);
    std::__cxx11::string::~string((string *)local_5c8);
    pvVar3 = local_28;
    std::operator+(local_608,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480);
    std::operator+(local_5e8,(char *)local_608);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_5e8);
    std::__cxx11::string::~string((string *)local_5e8);
    std::__cxx11::string::~string((string *)local_608);
    pvVar3 = local_28;
    std::operator+(local_668,(char *)local_480);
    std::operator+(local_648,local_668);
    std::operator+(local_628,(char *)local_648);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_628);
    std::__cxx11::string::~string((string *)local_628);
    std::__cxx11::string::~string((string *)local_648);
    std::__cxx11::string::~string((string *)local_668);
    pvVar3 = local_28;
    std::operator+(local_6c8,(char *)local_480);
    std::operator+(local_6a8,local_6c8);
    std::operator+(local_688,(char *)local_6a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_688);
    std::__cxx11::string::~string((string *)local_688);
    std::__cxx11::string::~string((string *)local_6a8);
    std::__cxx11::string::~string((string *)local_6c8);
    pvVar3 = local_28;
    std::operator+(local_728,(char *)local_458);
    std::operator+(local_708,local_728);
    std::operator+(local_6e8,(char *)local_708);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_6e8);
    std::__cxx11::string::~string((string *)local_6e8);
    std::__cxx11::string::~string((string *)local_708);
    std::__cxx11::string::~string((string *)local_728);
    std::__cxx11::string::~string(local_480);
    std::__cxx11::string::~string(local_458);
    std::__cxx11::string::~string((string *)local_438);
  }
  else if (pFStack_18[0x20] == (Frame)0xd) {
    int2str_sal_abi_cxx11_
              ((U64)local_748,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    pvVar3 = local_28;
    std::operator+((char *)local_768,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Byte count ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_768);
    std::__cxx11::string::~string((string *)local_768);
    pvVar3 = local_28;
    std::operator+((char *)local_788,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"ByteCount "
                  );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_788);
    std::__cxx11::string::~string((string *)local_788);
    pvVar3 = local_28;
    std::operator+((char *)&cmd.databyte_param_type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Cnt ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,(value_type *)&cmd.databyte_param_type);
    std::__cxx11::string::~string((string *)&cmd.databyte_param_type);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_748);
    std::__cxx11::string::~string((string *)local_748);
  }
  else if ((pFStack_18[0x20] == (Frame)0xb) || (pFStack_18[0x20] == (Frame)0xc)) {
    if (pFStack_18[0x20] == (Frame)0xb) {
      pCVar5 = GetPMBusCommandDesc(*(U64 *)(pFStack_18 + 0x10));
      cmd._0_8_ = pCVar5->name;
      cmd.name = *(char **)&pCVar5->data_length;
      cmd.data_length = pCVar5->databyte_param_type;
      cmd.direction = *(ParamDirection *)&pCVar5->field_0x1c;
    }
    else {
      pCVar5 = GetSmartBatteryCommandDesc(*(U64 *)(pFStack_18 + 0x10));
      cmd._0_8_ = pCVar5->name;
      cmd.name = *(char **)&pCVar5->data_length;
      cmd.data_length = pCVar5->databyte_param_type;
      cmd.direction = *(ParamDirection *)&pCVar5->field_0x1c;
    }
    int2str_sal_abi_cxx11_
              ((U64)local_7e8,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    pvVar3 = local_28;
    uVar2 = cmd._0_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_868,(char *)uVar2,&local_869);
    std::operator+((char *)local_848,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Command ");
    std::operator+(local_828,(char *)local_848);
    std::operator+(local_808,local_828);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_808);
    std::__cxx11::string::~string((string *)local_808);
    std::__cxx11::string::~string((string *)local_828);
    std::__cxx11::string::~string(local_848);
    std::__cxx11::string::~string(local_868);
    std::allocator<char>::~allocator((allocator<char> *)&local_869);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_7e8);
    pvVar3 = local_28;
    uVar2 = cmd._0_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_890,(char *)uVar2,&local_891);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,(value_type *)local_890);
    std::__cxx11::string::~string(local_890);
    std::allocator<char>::~allocator((allocator<char> *)&local_891);
    pvVar3 = local_28;
    uVar2 = cmd._0_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d8,(char *)uVar2,&local_8d9);
    std::operator+((char *)local_8b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Cmd ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_8b8);
    std::__cxx11::string::~string((string *)local_8b8);
    std::__cxx11::string::~string(local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
    pvVar3 = local_28;
    std::operator+((char *)local_900,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Cmd ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_900);
    std::__cxx11::string::~string((string *)local_900);
    pvVar3 = local_28;
    uVar2 = cmd._0_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_980,(char *)uVar2,&local_981);
    std::operator+((char *)local_960,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Cmd ");
    std::operator+(local_940,(char *)local_960);
    std::operator+(local_920,local_940);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_920);
    std::__cxx11::string::~string((string *)local_920);
    std::__cxx11::string::~string((string *)local_940);
    std::__cxx11::string::~string(local_960);
    std::__cxx11::string::~string(local_980);
    std::allocator<char>::~allocator((allocator<char> *)&local_981);
    pvVar3 = local_28;
    uVar2 = cmd._0_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_9c8,(char *)uVar2,&local_9c9);
    std::operator+((char *)local_9a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Command ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_9a8);
    std::__cxx11::string::~string((string *)local_9a8);
    std::__cxx11::string::~string(local_9c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
    pvVar3 = local_28;
    std::operator+((char *)local_9f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Command ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_9f0);
    std::__cxx11::string::~string((string *)local_9f0);
    std::__cxx11::string::~string((string *)local_7e8);
  }
  else if (pFStack_18[0x20] == (Frame)0xa) {
    int2str_sal_abi_cxx11_
              ((U64)local_a10,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    pvVar3 = local_28;
    std::operator+((char *)local_a30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Command ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_a30);
    std::__cxx11::string::~string((string *)local_a30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_a10);
    pvVar3 = local_28;
    std::operator+((char *)local_a50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Cmd ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_a50);
    std::__cxx11::string::~string((string *)local_a50);
    std::__cxx11::string::~string((string *)local_a10);
  }
  else if (pFStack_18[0x20] == (Frame)0xe) {
    int2str_sal_abi_cxx11_
              ((U64)local_a90,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    pvVar3 = local_28;
    std::operator+((char *)local_b30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Capability data byte ");
    std::operator+(local_b10,(char *)local_b30);
    std::operator+(local_af0,(char *)local_b10);
    std::operator+(local_ad0,(char *)local_af0);
    std::operator+(local_ab0,(char *)local_ad0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_ab0);
    std::__cxx11::string::~string((string *)local_ab0);
    std::__cxx11::string::~string((string *)local_ad0);
    std::__cxx11::string::~string((string *)local_af0);
    std::__cxx11::string::~string((string *)local_b10);
    std::__cxx11::string::~string(local_b30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_a90);
    pvVar3 = local_28;
    std::operator+((char *)local_b70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Capability ");
    std::operator+(local_b50,(char *)local_b70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_b50);
    std::__cxx11::string::~string((string *)local_b50);
    std::__cxx11::string::~string(local_b70);
    pvVar3 = local_28;
    std::operator+((char *)local_bf0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Capability ");
    std::operator+(local_bd0,(char *)local_bf0);
    std::operator+(local_bb0,(char *)local_bd0);
    std::operator+(local_b90,(char *)local_bb0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_b90);
    std::__cxx11::string::~string((string *)local_b90);
    std::__cxx11::string::~string((string *)local_bb0);
    std::__cxx11::string::~string((string *)local_bd0);
    std::__cxx11::string::~string(local_bf0);
    pvVar3 = local_28;
    std::operator+((char *)local_c90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Capability ");
    std::operator+(local_c70,(char *)local_c90);
    std::operator+(local_c50,(char *)local_c70);
    std::operator+(local_c30,(char *)local_c50);
    std::operator+(local_c10,(char *)local_c30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_c10);
    std::__cxx11::string::~string((string *)local_c10);
    std::__cxx11::string::~string((string *)local_c30);
    std::__cxx11::string::~string((string *)local_c50);
    std::__cxx11::string::~string((string *)local_c70);
    std::__cxx11::string::~string(local_c90);
    std::__cxx11::string::~string((string *)local_a90);
  }
  else if (pFStack_18[0x20] == (Frame)0xf) {
    uVar6 = *(ulong *)(pFStack_18 + 0x10);
    if ((uVar6 & 0x80) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e40,"Command unsupported",&local_e41);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_e40);
      std::__cxx11::string::~string(local_e40);
      std::allocator<char>::~allocator((allocator<char> *)&local_e41);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e68,"unsupported",&local_e69);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_e68);
      std::__cxx11::string::~string(local_e68);
      std::allocator<char>::~allocator((allocator<char> *)&local_e69);
    }
    else {
      pcVar4 = "";
      if ((uVar6 & 0x40) != 0) {
        pcVar4 = "for write";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cb8,pcVar4,(allocator *)((long)&for_read + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&for_read + 7));
      pvVar3 = local_28;
      format = "";
      if ((uVar6 & 0x20) != 0) {
        format = "for read";
      }
      switch((byte)uVar6 & 0x1c) {
      case 0:
        local_cd0 = "Linear data format";
        break;
      default:
        local_cd0 = "error format";
        break;
      case 0xc:
        local_cd0 = "Direct mode format";
        break;
      case 0x14:
        local_cd0 = "VID mode format";
        break;
      case 0x18:
        local_cd0 = "Manufacturer specific format";
      }
      std::operator+((char *)local_d30,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Command supported ");
      std::operator+(local_d10,(char *)local_d30);
      std::operator+(local_cf0,(char *)local_d10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,local_cf0);
      std::__cxx11::string::~string((string *)local_cf0);
      std::__cxx11::string::~string((string *)local_d10);
      std::__cxx11::string::~string(local_d30);
      pvVar3 = local_28;
      std::operator+((char *)local_d90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Command supported ");
      std::operator+(local_d70,(char *)local_d90);
      std::operator+(local_d50,(char *)local_d70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,local_d50);
      std::__cxx11::string::~string((string *)local_d50);
      std::__cxx11::string::~string((string *)local_d70);
      std::__cxx11::string::~string(local_d90);
      pvVar3 = local_28;
      std::operator+((char *)local_dd0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Command supported ");
      std::operator+(local_db0,(char *)local_dd0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,local_db0);
      std::__cxx11::string::~string((string *)local_db0);
      std::__cxx11::string::~string(local_dd0);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_df0,"Command supported...",&local_df1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_df0);
      std::__cxx11::string::~string(local_df0);
      std::allocator<char>::~allocator((allocator<char> *)&local_df1);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e18,"Supported...",&local_e19);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_e18);
      std::__cxx11::string::~string(local_e18);
      std::allocator<char>::~allocator((allocator<char> *)&local_e19);
      std::__cxx11::string::~string(local_cb8);
    }
  }
  else if (pFStack_18[0x20] == (Frame)0x10) {
    lVar1 = *(long *)(pFStack_18 + 0x10);
    if (lVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ff8,"Enable writes to all commands",&local_ff9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_ff8);
      std::__cxx11::string::~string(local_ff8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1020,"Enable...",&local_1021);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_1020);
      std::__cxx11::string::~string(local_1020);
      std::allocator<char>::~allocator((allocator<char> *)&local_1021);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1048,"Enable all writes...",&local_1049);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_1048);
      std::__cxx11::string::~string(local_1048);
      std::allocator<char>::~allocator((allocator<char> *)&local_1049);
    }
    else if (lVar1 == 0x20) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_f80,
                 "Disable all writes except to the WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND commands"
                 ,&local_f81);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_f80);
      std::__cxx11::string::~string(local_f80);
      std::allocator<char>::~allocator((allocator<char> *)&local_f81);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_fa8,"Disable...",&local_fa9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_fa8);
      std::__cxx11::string::~string(local_fa8);
      std::allocator<char>::~allocator((allocator<char> *)&local_fa9);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_fd0,
                 "Disable all except WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND..."
                 ,&local_fd1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_fd0);
      std::__cxx11::string::~string(local_fd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_fd1);
    }
    else if (lVar1 == 0x40) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_f08,
                 "Disable all writes except to the WRITE_PROTECT, OPERATION and PAGE commands",
                 &local_f09);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_f08);
      std::__cxx11::string::~string(local_f08);
      std::allocator<char>::~allocator((allocator<char> *)&local_f09);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f30,"Disable...",&local_f31);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_f30);
      std::__cxx11::string::~string(local_f30);
      std::allocator<char>::~allocator((allocator<char> *)&local_f31);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_f58,"Disable all except WRITE_PROTECT, OPERATION and PAGE...",&local_f59);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_f58);
      std::__cxx11::string::~string(local_f58);
      std::allocator<char>::~allocator((allocator<char> *)&local_f59);
    }
    else if (lVar1 == 0x80) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e90,"Disable all writes except to the WRITE_PROTECT command",&local_e91);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_e90);
      std::__cxx11::string::~string(local_e90);
      std::allocator<char>::~allocator((allocator<char> *)&local_e91);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_eb8,"Disable...",&local_eb9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_eb8);
      std::__cxx11::string::~string(local_eb8);
      std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ee0,"Disable all except WRITE_PROTECT...",&local_ee1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_ee0);
      std::__cxx11::string::~string(local_ee0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ee1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1070,"Invalid Data!",&local_1071);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_1070);
      std::__cxx11::string::~string(local_1070);
      std::allocator<char>::~allocator((allocator<char> *)&local_1071);
      pvVar3 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1098,"Invalid",&local_1099);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,(value_type *)local_1098);
      std::__cxx11::string::~string(local_1098);
      std::allocator<char>::~allocator((allocator<char> *)&local_1099);
    }
  }
  else if (pFStack_18[0x20] == (Frame)0x11) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_10c0,"<invalid>",(allocator *)((long)&margin_state + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&margin_state + 7));
    uVar6 = *(ulong *)(pFStack_18 + 0x10) & 0xc0;
    if (uVar6 == 0) {
      std::__cxx11::string::operator=(local_10c0,"Immediate off (no sequencing)");
    }
    else if (uVar6 == 0x40) {
      std::__cxx11::string::operator=(local_10c0,"Soft off (with sequencing)");
    }
    else if (uVar6 == 0x80) {
      std::__cxx11::string::operator=(local_10c0,"Unit on");
      switch((uint)*(undefined8 *)(pFStack_18 + 0x10) & 0x3c) {
      case 0x14:
        break;
      case 0x18:
        break;
      case 0x24:
        break;
      case 0x28:
      }
    }
    int2str_sal_abi_cxx11_
              ((U64)local_10f0,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    pvVar3 = local_28;
    std::operator+((char *)local_1190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Operation params ");
    std::operator+(local_1170,(char *)local_1190);
    std::operator+(local_1150,local_1170);
    std::operator+(local_1130,(char *)local_1150);
    std::operator+(local_1110,(char *)local_1130);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1110);
    std::__cxx11::string::~string((string *)local_1110);
    std::__cxx11::string::~string((string *)local_1130);
    std::__cxx11::string::~string((string *)local_1150);
    std::__cxx11::string::~string((string *)local_1170);
    std::__cxx11::string::~string(local_1190);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_10f0);
    pvVar3 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11b0,"Operation params...",&local_11b1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,(value_type *)local_11b0);
    std::__cxx11::string::~string(local_11b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_11b1);
    pvVar3 = local_28;
    std::operator+(local_11f8,(char *)local_10c0);
    std::operator+(local_11d8,(char *)local_11f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_11d8);
    std::__cxx11::string::~string((string *)local_11d8);
    std::__cxx11::string::~string((string *)local_11f8);
    std::__cxx11::string::~string((string *)local_10f0);
    std::__cxx11::string::~string(local_10c0);
  }
  else if (pFStack_18[0x20] == (Frame)0x12) {
    int2str_sal_abi_cxx11_
              ((U64)&power_up,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    pvVar3 = local_28;
    commands = "Any time";
    if ((*(uint *)(pFStack_18 + 0x10) & 0x10) != 0) {
      commands = "CONTROL pin and OPERATION command";
    }
    control = "Ignore on/off portion of OPERATION command";
    if ((*(uint *)(pFStack_18 + 0x10) & 8) != 0) {
      control = "Acknowledge on/off portion of OPERATION command";
    }
    polarity = "Ignore CONTROL pin";
    if ((*(uint *)(pFStack_18 + 0x10) & 4) != 0) {
      polarity = "CONTROL pin required to operate";
    }
    action = "CONTROL is active low";
    if ((*(uint *)(pFStack_18 + 0x10) & 2) != 0) {
      action = "CONTROL is active high";
    }
    local_1240 = "Use programmed turn off delay";
    if (((byte)pFStack_18[0x10] & 1) != 0) {
      local_1240 = "Turn off the output as fast as possible";
    }
    std::operator+((char *)local_1360,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Params ");
    std::operator+(local_1340,(char *)local_1360);
    std::operator+(local_1320,(char *)local_1340);
    std::operator+(local_1300,(char *)local_1320);
    std::operator+(local_12e0,(char *)local_1300);
    std::operator+(local_12c0,(char *)local_12e0);
    std::operator+(local_12a0,(char *)local_12c0);
    std::operator+(local_1280,(char *)local_12a0);
    std::operator+(local_1260,(char *)local_1280);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1260);
    std::__cxx11::string::~string((string *)local_1260);
    std::__cxx11::string::~string((string *)local_1280);
    std::__cxx11::string::~string((string *)local_12a0);
    std::__cxx11::string::~string((string *)local_12c0);
    std::__cxx11::string::~string((string *)local_12e0);
    std::__cxx11::string::~string((string *)local_1300);
    std::__cxx11::string::~string((string *)local_1320);
    std::__cxx11::string::~string((string *)local_1340);
    std::__cxx11::string::~string(local_1360);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,(value_type *)&power_up);
    pvVar3 = local_28;
    std::operator+((char *)local_13c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Params ");
    std::operator+(local_13a0,(char *)local_13c0);
    std::operator+(local_1380,(char *)local_13a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1380);
    std::__cxx11::string::~string((string *)local_1380);
    std::__cxx11::string::~string((string *)local_13a0);
    std::__cxx11::string::~string(local_13c0);
    pvVar3 = local_28;
    std::operator+((char *)local_1440,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Params ");
    std::operator+(local_1420,(char *)local_1440);
    std::operator+(local_1400,(char *)local_1420);
    std::operator+(local_13e0,(char *)local_1400);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_13e0);
    std::__cxx11::string::~string((string *)local_13e0);
    std::__cxx11::string::~string((string *)local_1400);
    std::__cxx11::string::~string((string *)local_1420);
    std::__cxx11::string::~string(local_1440);
    pvVar3 = local_28;
    std::operator+((char *)local_1500,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Params ");
    std::operator+(local_14e0,(char *)local_1500);
    std::operator+(local_14c0,(char *)local_14e0);
    std::operator+(local_14a0,(char *)local_14c0);
    std::operator+(local_1480,(char *)local_14a0);
    std::operator+(local_1460,(char *)local_1480);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1460);
    std::__cxx11::string::~string((string *)local_1460);
    std::__cxx11::string::~string((string *)local_1480);
    std::__cxx11::string::~string((string *)local_14a0);
    std::__cxx11::string::~string((string *)local_14c0);
    std::__cxx11::string::~string((string *)local_14e0);
    std::__cxx11::string::~string(local_1500);
    pvVar3 = local_28;
    std::operator+((char *)local_1600,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Params ");
    std::operator+(local_15e0,(char *)local_1600);
    std::operator+(local_15c0,(char *)local_15e0);
    std::operator+(local_15a0,(char *)local_15c0);
    std::operator+(local_1580,(char *)local_15a0);
    std::operator+(local_1560,(char *)local_1580);
    std::operator+(local_1540,(char *)local_1560);
    std::operator+(local_1520,(char *)local_1540);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1520);
    std::__cxx11::string::~string((string *)local_1520);
    std::__cxx11::string::~string((string *)local_1540);
    std::__cxx11::string::~string((string *)local_1560);
    std::__cxx11::string::~string((string *)local_1580);
    std::__cxx11::string::~string((string *)local_15a0);
    std::__cxx11::string::~string((string *)local_15c0);
    std::__cxx11::string::~string((string *)local_15e0);
    std::__cxx11::string::~string(local_1600);
    std::__cxx11::string::~string((string *)&power_up);
  }
  else if (pFStack_18[0x20] == (Frame)0x13) {
    int2str_sal_abi_cxx11_
              ((U64)local_1620,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    pvVar3 = local_28;
    local_1621 = (byte)(*(uint *)(pFStack_18 + 0x10) >> 5);
    local_1622 = (byte)pFStack_18[0x10] & 0x1f;
    std::operator+(local_16a8,(char *)local_1620);
    int2str_sal_abi_cxx11_((U64)local_16c8,(uint)local_1621,results_local._4_4_);
    std::operator+(local_1688,local_16a8);
    std::operator+(local_1668,(char *)local_1688);
    int2str_sal_abi_cxx11_((U64)local_16e8,(uint)local_1622,results_local._4_4_);
    std::operator+(local_1648,local_1668);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1648);
    std::__cxx11::string::~string((string *)local_1648);
    std::__cxx11::string::~string(local_16e8);
    std::__cxx11::string::~string((string *)local_1668);
    std::__cxx11::string::~string((string *)local_1688);
    std::__cxx11::string::~string(local_16c8);
    std::__cxx11::string::~string((string *)local_16a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_1620);
    std::__cxx11::string::~string((string *)local_1620);
  }
  else if (pFStack_18[0x20] == (Frame)0x14) {
    int2str_sal_abi_cxx11_
              ((U64)local_1708,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    std::operator+((char *)&v.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "BatteryMode ");
    std::operator+(local_1728,
                   (char *)&v.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &v.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1760);
    BitFieldToDescAll(BatteryModeBits,*(U64 *)(pFStack_18 + 0x10),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1760);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1780,"",&local_1781);
    AddResultStringsFromVector
              (this,local_1728,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1760,(string *)local_1780,local_28);
    std::__cxx11::string::~string(local_1780);
    std::allocator<char>::~allocator((allocator<char> *)&local_1781);
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(local_28);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(local_28);
    std::swap<char,std::char_traits<char>,std::allocator<char>>(pvVar8,pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_1708);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1760);
    std::__cxx11::string::~string((string *)local_1728);
    std::__cxx11::string::~string((string *)local_1708);
  }
  else if (pFStack_18[0x20] == (Frame)0x15) {
    int2str_sal_abi_cxx11_
              ((U64)local_17a8,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    std::operator+((char *)&v_1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "BatteryStatus ");
    std::operator+(local_17c8,
                   (char *)&v_1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &v_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1800);
    BitFieldToDescAll(BatteryStatusBits,*(U64 *)(pFStack_18 + 0x10),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1800);
    pcVar4 = ErrorCodesDesc[*(uint *)(pFStack_18 + 0x10) & 7];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1840,pcVar4,&local_1841);
    std::operator+((char *)local_1820,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"ErrorCode="
                  );
    AddResultStringsFromVector
              (this,local_17c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1800,local_1820,local_28);
    std::__cxx11::string::~string((string *)local_1820);
    std::__cxx11::string::~string(local_1840);
    std::allocator<char>::~allocator((allocator<char> *)&local_1841);
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(local_28);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(local_28);
    std::swap<char,std::char_traits<char>,std::allocator<char>>(pvVar8,pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_17a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1800);
    std::__cxx11::string::~string((string *)local_17c8);
    std::__cxx11::string::~string((string *)local_17a8);
  }
  else if (pFStack_18[0x20] == (Frame)0x16) {
    int2str_sal_abi_cxx11_
              ((U64)local_1868,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    pvVar3 = local_28;
    local_1869 = (byte)pFStack_18[0x10] & 0xf;
    local_186a = (byte)pFStack_18[0x10] >> 4;
    local_186b = (byte)pFStack_18[0x11] & 0xf;
    local_186c = (byte)(*(uint *)(pFStack_18 + 0x10) >> 0xc);
    std::operator+((char *)local_1990,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "SpecificationInfo ");
    std::operator+(local_1970,(char *)local_1990);
    int2str_sal_abi_cxx11_((U64)local_19b0,(uint)local_1869,results_local._4_4_);
    std::operator+(local_1950,local_1970);
    std::operator+(local_1930,(char *)local_1950);
    int2str_sal_abi_cxx11_((U64)local_19d0,(uint)local_186a,results_local._4_4_);
    std::operator+(local_1910,local_1930);
    std::operator+(local_18f0,(char *)local_1910);
    int2str_sal_abi_cxx11_((U64)local_19f0,(uint)local_186b,results_local._4_4_);
    std::operator+(local_18d0,local_18f0);
    std::operator+(local_18b0,(char *)local_18d0);
    int2str_sal_abi_cxx11_((U64)local_1a10,(uint)local_186c,results_local._4_4_);
    std::operator+(local_1890,local_18b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1890);
    std::__cxx11::string::~string((string *)local_1890);
    std::__cxx11::string::~string(local_1a10);
    std::__cxx11::string::~string((string *)local_18b0);
    std::__cxx11::string::~string((string *)local_18d0);
    std::__cxx11::string::~string(local_19f0);
    std::__cxx11::string::~string((string *)local_18f0);
    std::__cxx11::string::~string((string *)local_1910);
    std::__cxx11::string::~string(local_19d0);
    std::__cxx11::string::~string((string *)local_1930);
    std::__cxx11::string::~string((string *)local_1950);
    std::__cxx11::string::~string(local_19b0);
    std::__cxx11::string::~string((string *)local_1970);
    std::__cxx11::string::~string(local_1990);
    pvVar3 = local_28;
    std::operator+((char *)local_1a90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "SpecificationInfo ");
    std::operator+(local_1a70,(char *)local_1a90);
    int2str_sal_abi_cxx11_((U64)local_1ab0,(uint)local_1869,results_local._4_4_);
    std::operator+(local_1a50,local_1a70);
    std::operator+(local_1a30,(char *)local_1a50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1a30);
    std::__cxx11::string::~string((string *)local_1a30);
    std::__cxx11::string::~string((string *)local_1a50);
    std::__cxx11::string::~string(local_1ab0);
    std::__cxx11::string::~string((string *)local_1a70);
    std::__cxx11::string::~string(local_1a90);
    pvVar3 = local_28;
    std::operator+((char *)local_1b70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "SpecificationInfo ");
    std::operator+(local_1b50,(char *)local_1b70);
    int2str_sal_abi_cxx11_((U64)local_1b90,(uint)local_1869,results_local._4_4_);
    std::operator+(local_1b30,local_1b50);
    std::operator+(local_1b10,(char *)local_1b30);
    int2str_sal_abi_cxx11_((U64)local_1bb0,(uint)local_186a,results_local._4_4_);
    std::operator+(local_1af0,local_1b10);
    std::operator+(local_1ad0,(char *)local_1af0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1ad0);
    std::__cxx11::string::~string((string *)local_1ad0);
    std::__cxx11::string::~string((string *)local_1af0);
    std::__cxx11::string::~string(local_1bb0);
    std::__cxx11::string::~string((string *)local_1b10);
    std::__cxx11::string::~string((string *)local_1b30);
    std::__cxx11::string::~string(local_1b90);
    std::__cxx11::string::~string((string *)local_1b50);
    std::__cxx11::string::~string(local_1b70);
    pvVar3 = local_28;
    std::operator+((char *)local_1cb0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "SpecificationInfo ");
    std::operator+(local_1c90,(char *)local_1cb0);
    int2str_sal_abi_cxx11_((U64)local_1cd0,(uint)local_1869,results_local._4_4_);
    std::operator+(local_1c70,local_1c90);
    std::operator+(local_1c50,(char *)local_1c70);
    int2str_sal_abi_cxx11_((U64)local_1cf0,(uint)local_186a,results_local._4_4_);
    std::operator+(local_1c30,local_1c50);
    std::operator+(local_1c10,(char *)local_1c30);
    int2str_sal_abi_cxx11_((U64)local_1d10,(uint)local_186b,results_local._4_4_);
    std::operator+(local_1bf0,local_1c10);
    std::operator+(local_1bd0,(char *)local_1bf0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1bd0);
    std::__cxx11::string::~string((string *)local_1bd0);
    std::__cxx11::string::~string((string *)local_1bf0);
    std::__cxx11::string::~string(local_1d10);
    std::__cxx11::string::~string((string *)local_1c10);
    std::__cxx11::string::~string((string *)local_1c30);
    std::__cxx11::string::~string(local_1cf0);
    std::__cxx11::string::~string((string *)local_1c50);
    std::__cxx11::string::~string((string *)local_1c70);
    std::__cxx11::string::~string(local_1cd0);
    std::__cxx11::string::~string((string *)local_1c90);
    std::__cxx11::string::~string(local_1cb0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_1868);
    pvVar3 = local_28;
    std::operator+((char *)local_1d50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "SpecificationInfo ");
    std::operator+(local_1d30,(char *)local_1d50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1d30);
    std::__cxx11::string::~string((string *)local_1d30);
    std::__cxx11::string::~string(local_1d50);
    std::__cxx11::string::~string((string *)local_1868);
  }
  else if (pFStack_18[0x20] == (Frame)0x17) {
    int2str_sal_abi_cxx11_
              ((U64)local_1d70,(DisplayBase)*(undefined8 *)(pFStack_18 + 0x10),results_local._4_4_);
    int2str_abi_cxx11_((U64)local_1e18);
    std::operator+(local_1df8,(char *)local_1e18);
    int2str_abi_cxx11_((U64)local_1e38);
    std::operator+(local_1dd8,local_1df8);
    std::operator+(local_1db8,(char *)local_1dd8);
    int2str_abi_cxx11_((U64)local_1e58);
    std::operator+(local_1d98,local_1db8);
    std::__cxx11::string::~string(local_1e58);
    std::__cxx11::string::~string((string *)local_1db8);
    std::__cxx11::string::~string((string *)local_1dd8);
    std::__cxx11::string::~string(local_1e38);
    std::__cxx11::string::~string((string *)local_1df8);
    std::__cxx11::string::~string(local_1e18);
    pvVar3 = local_28;
    std::operator+((char *)local_1eb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "ManufactureDate ");
    std::operator+(local_1e98,(char *)local_1eb8);
    std::operator+(local_1e78,local_1e98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1e78);
    std::__cxx11::string::~string((string *)local_1e78);
    std::__cxx11::string::~string((string *)local_1e98);
    std::__cxx11::string::~string(local_1eb8);
    pvVar3 = local_28;
    std::operator+((char *)local_1ef8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "ManufactureDate ");
    std::operator+(local_1ed8,(char *)local_1ef8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,local_1ed8);
    std::__cxx11::string::~string((string *)local_1ed8);
    std::__cxx11::string::~string(local_1ef8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_28,local_1d70);
    std::__cxx11::string::~string((string *)local_1d98);
    std::__cxx11::string::~string((string *)local_1d70);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f18,".",(allocator *)((long)&pProt + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar3,(value_type *)local_1f18);
    std::__cxx11::string::~string(local_1f18);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pProt + 7));
  }
  if ((*(long *)(pFStack_18 + 0x18) != 0) && (pFStack_18[0x20] != (Frame)0x9)) {
    local_1f28 = *(undefined8 **)(pFStack_18 + 0x18);
    pcVar4 = (char *)*local_1f28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f68,pcVar4,&local_1f69);
    std::operator+((char *)local_1f48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" Protocol="
                  );
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(local_28);
    std::__cxx11::string::operator+=((string *)pvVar8,local_1f48);
    std::__cxx11::string::~string(local_1f48);
    std::__cxx11::string::~string(local_1f68);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f69);
  }
  return;
}

Assistant:

void SMBusAnalyzerResults::GetBubbleText( const Frame& f, DisplayBase display_base, std::vector<std::string>& results )
{
    results.clear();

    if( f.mType == SMB_Start )
    {
        if( mSettings->mDecodeLevel == DL_Signals )
            results.push_back( "Start" );
    }
    else if( f.mType == SMB_Stop )
    {
        if( mSettings->mDecodeLevel == DL_Signals )
            results.push_back( "Stop" );
    }
    else if( f.mType == SMB_Zero )
        results.push_back( "0" );
    else if( f.mType == SMB_One )
        results.push_back( "1" );
    else if( f.mType == SMB_ACK )
        results.push_back( "ACK" );
    else if( f.mType == SMB_NACK )
        results.push_back( "NACK" );
    else if( f.mType == FT_Byte )
    {
        std::string num( int2str_sal( f.mData1, display_base, 8 ) );
        results.push_back( "Byte " + num + ( ( f.mFlags & F_IsAcked ) ? " ACK" : " NACK" ) );
        results.push_back( "Byte " + num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num );
    }
    else if( f.mType == FT_Word )
    {
        std::string num( int2str_sal( f.mData1, display_base, 16 ) );

        results.push_back( "Word " + num + ( ( f.mFlags & F_IsAcked ) ? " ACK" : " NACK" ) );
        results.push_back( "Word " + num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num );
    }
    else if( f.mType == FT_PEC )
    {
        std::string readPEC( int2str_sal( f.mData1, display_base, 8 ) );
        std::string calcedPEC( int2str_sal( f.mData2, display_base, 8 ) );

        if( f.mData1 == f.mData2 )
        {
            results.push_back( "PEC " + readPEC + " OK" );
            results.push_back( readPEC + " OK" );
            results.push_back( "PEC OK" );
        }
        else
        {
            results.push_back( "Bad PEC " + readPEC + " should be " + calcedPEC );
            results.push_back( readPEC + " bad PEC!" );
            results.push_back( "Bad PEC!" );
        }

        results.push_back( readPEC );
    }
    else if( f.mType == FT_Address )
    {
        std::string addr( int2str_sal( f.mData1, display_base, 7 ) );
        std::string rw = ( f.mFlags & F_IsRead ) ? "Read " : "Write ";
        std::string rw_s = ( f.mFlags & F_IsRead ) ? "R " : "W ";
        const bool is_acked = f.mFlags & F_IsAcked;

        results.push_back( rw + "address " + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( addr );
        results.push_back( addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw + addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( rw_s + addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw_s + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( rw_s + "addr " + addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw_s + "address " + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( rw + "addr " + addr + ( is_acked ? " A" : " N" ) );
    }
    else if( f.mType == FT_ByteCount )
    {
        std::string bc_str( int2str_sal( f.mData1, display_base, 7 ) );

        results.push_back( "Byte count " + bc_str );
        results.push_back( "ByteCount " + bc_str );
        results.push_back( "Cnt " + bc_str );
        results.push_back( bc_str );
    }
    else if( f.mType == FT_CmdPMBus || f.mType == FT_CmdSmartBattery )
    {
        CommandDesc cmd;
        if( f.mType == FT_CmdPMBus )
            cmd = GetPMBusCommandDesc( f.mData1 );
        else
            cmd = GetSmartBatteryCommandDesc( f.mData1 );

        std::string id( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Command " + std::string( cmd.name ) + " " + id );
        results.push_back( id );
        results.push_back( cmd.name );
        results.push_back( "Cmd " + std::string( cmd.name ) );
        results.push_back( "Cmd " + id );
        results.push_back( "Cmd " + std::string( cmd.name ) + " " + id );
        results.push_back( "Command " + std::string( cmd.name ) );
        results.push_back( "Command " + id );
    }
    else if( f.mType == FT_CmdSMBus )
    {
        std::string id( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Command " + id );
        results.push_back( id );
        results.push_back( "Cmd " + id );
    }
    else if( f.mType == FT_PMBusCapability )
    {
        U8 bm = ( U8 )f.mData1;
        const char* pec_desc = ( f.mData1 & 0x80 ? "PEC unsupported, " : "PEC supported, " );

        const char* max_bus_speed;
        switch( f.mData1 & 0x60 )
        {
        case 0x00:
            max_bus_speed = "Max bus speed 100KHz, ";
            break;
        case 0x20:
            max_bus_speed = "Max bus speed 400KHz, ";
            break;
        default:
            max_bus_speed = "Reserved, ";
            break;
        }

        const char* smbalert_desc = ( ( f.mData1 & 0x10 ) ? "SMBALERT supported " : "SMBALERT unsupported " );

        std::string val_str( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Capability data byte " + val_str + " " + pec_desc + max_bus_speed + smbalert_desc );
        results.push_back( val_str );
        results.push_back( "Capability " + val_str + " ..." );
        results.push_back( "Capability " + val_str + " " + pec_desc + "..." );
        results.push_back( "Capability " + val_str + " " + pec_desc + max_bus_speed + "..." );
    }
    else if( f.mType == FT_PMBusQuery )
    {
        U8 bm = ( U8 )f.mData1;

        // command supported?
        if( bm & 0x80 )
        {
            std::string for_write = ( bm & 0x40 ) ? "for write" : "";
            const char* for_read = ( bm & 0x20 ) ? "for read" : "";
            const char* format;
            switch( bm & 0x1C )
            {
            case 0x00:
                format = "Linear data format";
                break;
            case 0x0C:
                format = "Direct mode format";
                break;
            case 0x14:
                format = "VID mode format";
                break;
            case 0x18:
                format = "Manufacturer specific format";
                break;
            default:
                format = "error format";
                break;
            }

            results.push_back( "Command supported " + for_write + for_read + format );
            results.push_back( "Command supported " + for_write + for_read + "..." );
            results.push_back( "Command supported " + for_write + "..." );
            results.push_back( "Command supported..." );
            results.push_back( "Supported..." );
        }
        else
        {
            results.push_back( "Command unsupported" );
            results.push_back( "unsupported" );
        }
    }
    else if( f.mType == FT_PMBusWriteProtect )
    {
        switch( f.mData1 )
        {
        case 0x80:
            results.push_back( "Disable all writes except to the WRITE_PROTECT command" );
            results.push_back( "Disable..." );
            results.push_back( "Disable all except WRITE_PROTECT..." );
            break;
        case 0x40:
            results.push_back( "Disable all writes except to the WRITE_PROTECT, OPERATION and PAGE commands" );
            results.push_back( "Disable..." );
            results.push_back( "Disable all except WRITE_PROTECT, OPERATION and PAGE..." );
            break;
        case 0x20:
            results.push_back( "Disable all writes except to the WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND commands" );
            results.push_back( "Disable..." );
            results.push_back( "Disable all except WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND..." );
            break;
        case 0x00:
            results.push_back( "Enable writes to all commands" );
            results.push_back( "Enable..." );
            results.push_back( "Enable all writes..." );
            break;
        default:
            results.push_back( "Invalid Data!" );
            results.push_back( "Invalid" );
            break;
        }
    }
    else if( f.mType == FT_PMBusOperation )
    {
        std::string unit_on_off = "<invalid>";
        const char* margin_state = "<invalid>";
        switch( f.mData1 & 0xC0 )
        {
        case 0x00:
            unit_on_off = "Immediate off (no sequencing)";
            margin_state = "N/A";
            break;
        case 0x40:
            unit_on_off = "Soft off (with sequencing)";
            margin_state = "N/A";
            break;
        case 0x80:
            unit_on_off = "Unit on";
            switch( f.mData1 & 0x3C )
            {
            case 0x14:
                margin_state = "Margin low (ignore fault)";
                break;
            case 0x18:
                margin_state = "Margin low (act on fault)";
                break;
            case 0x24:
                margin_state = "Margin high (ignore fault)";
                break;
            case 0x28:
                margin_state = "Margin high (act on fault)";
                break;
            }
            break;
        }

        std::string val( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Operation params " + val + " Unit on/off=" + unit_on_off + ", Margin state=" + margin_state );
        results.push_back( val );
        results.push_back( "Operation params..." );
        results.push_back( unit_on_off + ", " + margin_state );
    }
    else if( f.mType == FT_PMBusOnOffConfig )
    {
        std::string val( int2str_sal( f.mData1, display_base, 8 ) );

        const char* power_up = ( f.mData1 & 0x10 ) ? "CONTROL pin and OPERATION command" : "Any time";
        const char* commands =
            ( f.mData1 & 0x08 ) ? "Acknowledge on/off portion of OPERATION command" : "Ignore on/off portion of OPERATION command";
        const char* control = ( f.mData1 & 0x04 ) ? "CONTROL pin required to operate" : "Ignore CONTROL pin";
        const char* polarity = ( f.mData1 & 0x02 ) ? "CONTROL is active high" : "CONTROL is active low";
        const char* action = ( f.mData1 & 0x01 ) ? "Turn off the output as fast as possible" : "Use programmed turn off delay";

        results.push_back( "Params " + val + ": " + power_up + ", " + commands + ", " + polarity + ", " + action );
        results.push_back( val );
        results.push_back( "Params " + val + ": " + power_up );
        results.push_back( "Params " + val + ": " + power_up + "..." );
        results.push_back( "Params " + val + ": " + power_up + ", " + commands + "..." );
        results.push_back( "Params " + val + ": " + power_up + ", " + commands + ", " + polarity + "..." );
    }
    else if( f.mType == FT_PMBusVoutMode )
    {
        std::string val( int2str_sal( f.mData1, display_base, 8 ) );

        U8 mode = U8( f.mData1 >> 5 );
        U8 param = U8( f.mData1 & 0x1F );

        results.push_back( val + " Mode: " + int2str_sal( mode, display_base, 3 ) + " Param: " + int2str_sal( param, display_base, 5 ) );
        results.push_back( val );
    }
    else if( f.mType == FT_SmartBattBatteryMode )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );
        std::string prefix( "BatteryMode " + val + " " );

        std::vector<std::string> v;
        BitFieldToDescAll( BatteryModeBits, f.mData1, v );

        AddResultStringsFromVector( prefix, v, "", results );

        // make sure the longest description is the first in the vector
        std::swap( results.front(), results.back() );

        results.push_back( val );
    }
    else if( f.mType == FT_SmartBattBatteryStatus )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );
        std::string prefix( "BatteryStatus " + val + " " );

        std::vector<std::string> v;
        BitFieldToDescAll( BatteryStatusBits, f.mData1, v );

        AddResultStringsFromVector( prefix, v, "ErrorCode=" + std::string( ErrorCodesDesc[ f.mData1 & 0x07 ] ), results );

        // make sure the longest description is the first in the vector
        std::swap( results.front(), results.back() );

        results.push_back( val );
    }
    else if( f.mType == FT_SmartBattSpecificationInfo )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );

        U8 revision = f.mData1 & 0x0f;
        U8 version = ( f.mData1 >> 4 ) & 0x0f;
        U8 vscale = ( f.mData1 >> 8 ) & 0x0f;
        U8 ipscale = U8( f.mData1 >> 12 );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) +
                           " Version=" + int2str_sal( version, display_base, 4 ) + " VScale=" + int2str_sal( vscale, display_base, 4 ) +
                           " IPScale=" + int2str_sal( ipscale, display_base, 4 ) );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) + ", ..." );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) +
                           " Version=" + int2str_sal( version, display_base, 4 ) + ", ..." );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) + " Version=" +
                           int2str_sal( version, display_base, 4 ) + " VScale=" + int2str_sal( vscale, display_base, 4 ) + ", ..." );

        results.push_back( val );
        results.push_back( "SpecificationInfo " + val + " ..." );
    }
    else if( f.mType == FT_SmartBattManufactureDate )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );

        U8 day = f.mData1 & 0x1f;            // 5 bits
        U8 month = ( f.mData1 >> 5 ) & 0x0f; // 4 bits
        U16 year = ( f.mData1 >> 9 ) & 0x9f; // 7 bits
        year += 1980;

        std::string date( int2str( month ) + "/" + int2str( day ) + "/" + int2str( year ) );

        results.push_back( "ManufactureDate " + val + " " + date );
        results.push_back( "ManufactureDate " + val + " ..." );
        results.push_back( val );
    }
    else
    {
        results.push_back( "." );
    }

    // add the protocol name
    if( f.mData2 != 0 && f.mType != FT_PEC )
    {
        const SMBusProtocol* pProt = ( const SMBusProtocol* )f.mData2;
        results.front() += " Protocol=" + std::string( pProt->name );
    }
}